

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O2

void __thiscall
cmCPackIFWPackage::DependenceStruct::DependenceStruct(DependenceStruct *this,string *dependence)

{
  long lVar1;
  char cVar2;
  long lStack_50;
  string asStack_48 [32];
  
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->Compare).Type = 0;
  (this->Compare).Value._M_dataplus._M_p = (pointer)&(this->Compare).Value.field_2;
  (this->Compare).Value._M_string_length = 0;
  (this->Compare).Value.field_2._M_local_buf[0] = '\0';
  lStack_50 = std::__cxx11::string::find((char *)dependence,0x551425);
  cVar2 = (char)dependence;
  if (lStack_50 == -1) {
    lStack_50 = std::__cxx11::string::find((char *)dependence,0x551428);
    if (lStack_50 == -1) {
      lStack_50 = std::__cxx11::string::find(cVar2,0x3c);
      if (lStack_50 == -1) {
        lStack_50 = std::__cxx11::string::find(cVar2,0x3d);
        if (lStack_50 == -1) {
          lStack_50 = std::__cxx11::string::find(cVar2,0x3e);
          if (lStack_50 == -1) {
            lStack_50 = std::__cxx11::string::find(cVar2,0x2d);
            if (lStack_50 == -1) {
              lStack_50 = -1;
              goto LAB_002d9350;
            }
            (this->Compare).Type = 0;
            std::__cxx11::string::substr((ulong)asStack_48,(ulong)dependence);
          }
          else {
            (this->Compare).Type = 4;
            std::__cxx11::string::substr((ulong)asStack_48,(ulong)dependence);
          }
        }
        else {
          (this->Compare).Type = 1;
          std::__cxx11::string::substr((ulong)asStack_48,(ulong)dependence);
        }
      }
      else {
        (this->Compare).Type = 2;
        std::__cxx11::string::substr((ulong)asStack_48,(ulong)dependence);
      }
    }
    else {
      (this->Compare).Type = 5;
      std::__cxx11::string::substr((ulong)asStack_48,(ulong)dependence);
    }
  }
  else {
    (this->Compare).Type = 3;
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)dependence);
  }
  std::__cxx11::string::operator=((string *)&(this->Compare).Value,asStack_48);
  std::__cxx11::string::~string(asStack_48);
LAB_002d9350:
  lVar1 = std::__cxx11::string::find(cVar2,0x2d);
  if (lVar1 != -1) {
    lStack_50 = lVar1;
  }
  if (lStack_50 == -1) {
    std::__cxx11::string::string(asStack_48,(string *)dependence);
  }
  else {
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)dependence);
  }
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::~string(asStack_48);
  return;
}

Assistant:

cmCPackIFWPackage::DependenceStruct::DependenceStruct(
  const std::string& dependence)
{
  // Search compare section
  size_t pos = std::string::npos;
  if ((pos = dependence.find("<=")) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareLessOrEqual;
    this->Compare.Value = dependence.substr(pos + 2);
  } else if ((pos = dependence.find(">=")) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareGreaterOrEqual;
    this->Compare.Value = dependence.substr(pos + 2);
  } else if ((pos = dependence.find('<')) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareLess;
    this->Compare.Value = dependence.substr(pos + 1);
  } else if ((pos = dependence.find('=')) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareEqual;
    this->Compare.Value = dependence.substr(pos + 1);
  } else if ((pos = dependence.find('>')) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareGreater;
    this->Compare.Value = dependence.substr(pos + 1);
  } else if ((pos = dependence.find('-')) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareNone;
    this->Compare.Value = dependence.substr(pos + 1);
  }
  size_t dashPos = dependence.find('-');
  if (dashPos != std::string::npos) {
    pos = dashPos;
  }
  this->Name =
    pos == std::string::npos ? dependence : dependence.substr(0, pos);
}